

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> * __thiscall
ary::BinaryPatternLocalizer::localize
          (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
           *__return_storage_ptr__,BinaryPatternLocalizer *this,Mat *image)

{
  allocator<cv::Point_<float>_> *paVar1;
  pointer pPVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  reference vec;
  reference pvVar7;
  reference pvVar8;
  reference this_00;
  reference pvVar9;
  PlanarLocalization *this_01;
  int in_R8D;
  float fVar10;
  float _width;
  float _height;
  double dVar11;
  byte local_551;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_4f0;
  Size_<float> local_4d8;
  Ptr<ary::PlanarLocalization> local_4d0;
  Ptr<ary::Localization> local_4c0;
  undefined1 local_4b0 [8];
  CameraPosition camera;
  int id;
  int orientation;
  double confidence;
  TermCriteria local_480;
  Size_<int> local_470;
  Size_<int> local_468;
  _InputOutputArray local_460;
  _InputArray local_448;
  Point_<float> local_42c;
  int local_424;
  double dStack_420;
  int v1;
  double dmin;
  double d;
  Rect box;
  int j;
  _InputArray local_398;
  _OutputArray local_380;
  _InputArray local_368;
  _InputArray local_350;
  double local_338;
  double per;
  Mat contourMat;
  undefined1 local_2c8 [8];
  Mat rectifiedPatch;
  int local_260;
  int pMaxX;
  int pMaxY;
  int pMinY;
  int pMinX;
  Point p;
  uint i;
  _OutputArray local_240;
  _InputArray local_228;
  int local_20c;
  undefined1 local_208 [4];
  int avsize;
  Point_<int> local_1e8;
  Mat local_1e0;
  _InputArray local_180;
  _OutputArray local_168;
  _InputArray local_150;
  _OutputArray local_138;
  _InputArray local_120;
  _OutputArray local_108;
  _InputArray local_f0;
  _InputArray local_d8;
  undefined1 local_c0 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> polycont;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  undefined1 local_88 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> rotated;
  undefined1 local_68 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> refined;
  allocator<cv::Point_<float>_> local_39;
  undefined1 local_38 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> roi;
  Mat *image_local;
  BinaryPatternLocalizer *this_local;
  vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> *localizations;
  
  roi.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)image;
  std::allocator<cv::Point_<float>_>::allocator(&local_39);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_38,4,&local_39)
  ;
  std::allocator<cv::Point_<float>_>::~allocator(&local_39);
  paVar1 = (allocator<cv::Point_<float>_> *)
           ((long)&rotated.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cv::Point_<float>_>::allocator(paVar1);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68,4,paVar1);
  std::allocator<cv::Point_<float>_>::~allocator
            ((allocator<cv::Point_<float>_> *)
             ((long)&rotated.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<cv::Point_<float>_> *)
           ((long)&contours.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cv::Point_<float>_>::allocator(paVar1);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_88,4,paVar1);
  std::allocator<cv::Point_<float>_>::~allocator
            ((allocator<cv::Point_<float>_> *)
             ((long)&contours.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)&polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0);
  iVar3 = cv::Mat::channels((Mat *)roi.
                                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pPVar2 = roi.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3 == 3) {
    cv::_InputArray::_InputArray
              (&local_d8,
               (Mat *)roi.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_f0,&this->grayImage);
    cv::cvtColor((cv *)&local_d8,&local_f0,(_OutputArray *)0x6,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_f0);
    cv::_InputArray::~_InputArray(&local_d8);
  }
  else {
    cv::_OutputArray::_OutputArray(&local_108,&this->grayImage);
    cv::Mat::copyTo((_OutputArray *)pPVar2);
    cv::_OutputArray::~_OutputArray(&local_108);
  }
  cv::_InputArray::_InputArray(&local_120,&this->grayImage);
  cv::_OutputArray::_OutputArray(&local_138,&this->binImage);
  cv::adaptiveThreshold
            (&local_120,&local_138,255.0,1,1,(int)this->block_size,(double)(int)this->threshold);
  cv::_OutputArray::~_OutputArray(&local_138);
  cv::_InputArray::~_InputArray(&local_120);
  cv::_InputArray::_InputArray(&local_150,&this->binImage);
  cv::_OutputArray::_OutputArray(&local_168,&this->binImage);
  cv::Mat::Mat(&local_1e0);
  cv::_InputArray::_InputArray(&local_180,&local_1e0);
  cv::Point_<int>::Point_(&local_1e8,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_150,&local_168,&local_180,&local_1e8,1,0,local_208);
  cv::_InputArray::~_InputArray(&local_180);
  cv::Mat::~Mat(&local_1e0);
  cv::_OutputArray::~_OutputArray(&local_168);
  cv::_InputArray::~_InputArray(&local_150);
  local_20c = ((this->binImage).rows + (this->binImage).cols) / 2;
  cv::_InputArray::_InputArray(&local_228,&this->binImage);
  cv::_OutputArray::_OutputArray<cv::Point_<int>>
            (&local_240,
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)&polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Point_<int>::Point_((Point_<int> *)&p.y);
  cv::findContours(&local_228,&local_240,1,2,&p.y);
  cv::_OutputArray::~_OutputArray(&local_240);
  cv::_InputArray::~_InputArray(&local_228);
  cv::Point_<int>::Point_((Point_<int> *)&pMinY);
  cv::Mat::Mat((Mat *)local_2c8,100,100,0);
  contourMat.step.buf[1]._7_1_ = 0;
  std::vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>::vector
            (__return_storage_ptr__);
  for (p.x = 0; uVar5 = (ulong)(uint)p.x,
      sVar6 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      *)&polycont.
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage), uVar5 < sVar6;
      p.x = p.x + 1) {
    vec = std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        *)&polycont.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)p.x);
    cv::Mat::Mat<cv::Point_<int>>((Mat *)&per,vec,false);
    cv::_InputArray::_InputArray(&local_350,(Mat *)&per);
    dVar11 = (double)cv::arcLength(&local_350,true);
    cv::_InputArray::~_InputArray(&local_350);
    local_338 = dVar11;
    if (((double)(local_20c / 6) < dVar11) && (dVar11 < (double)(local_20c << 2))) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0);
      cv::_InputArray::_InputArray(&local_368,(Mat *)&per);
      cv::_OutputArray::_OutputArray<cv::Point_<int>>
                (&local_380,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0);
      cv::approxPolyDP(&local_368,&local_380,local_338 * 0.02,true);
      cv::_OutputArray::~_OutputArray(&local_380);
      cv::_InputArray::~_InputArray(&local_368);
      sVar6 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                        ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0);
      box.height._3_1_ = 0;
      box.height._2_1_ = 0;
      local_551 = 0;
      if (sVar6 == 4) {
        cv::Mat::Mat<cv::Point_<int>>
                  ((Mat *)&j,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0,
                   false);
        box.height._3_1_ = 1;
        cv::_InputArray::_InputArray(&local_398,(Mat *)&j);
        box.height._2_1_ = 1;
        local_551 = cv::isContourConvex(&local_398);
      }
      if ((box.height._2_1_ & 1) != 0) {
        cv::_InputArray::~_InputArray(&local_398);
      }
      if ((box.height._3_1_ & 1) != 0) {
        cv::Mat::~Mat((Mat *)&j);
      }
      if ((local_551 & 1) != 0) {
        pvVar7 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                           ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0,0
                           );
        cv::Point_<int>::operator=((Point_<int> *)&pMinY,pvVar7);
        rectifiedPatch.step.buf[1]._4_4_ = pMinY;
        pMaxY = pMinY;
        local_260 = pMinX;
        pMaxX = pMinX;
        for (box.width = 1; box.width < 4; box.width = box.width + 1) {
          pvVar7 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                             ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0
                              ,(long)box.width);
          cv::Point_<int>::operator=((Point_<int> *)&pMinY,pvVar7);
          if (pMinY < pMaxY) {
            pMaxY = pMinY;
          }
          if (rectifiedPatch.step.buf[1]._4_4_ < pMinY) {
            rectifiedPatch.step.buf[1]._4_4_ = pMinY;
          }
          if (pMinX < pMaxX) {
            pMaxX = pMinX;
          }
          if (local_260 < pMinX) {
            local_260 = pMinX;
          }
        }
        cv::Rect_<int>::Rect_
                  ((Rect_<int> *)&d,pMaxY,pMaxX,(rectifiedPatch.step.buf[1]._4_4_ - pMaxY) + 1,
                   (local_260 - pMaxX) + 1);
        dStack_420 = (double)(local_20c * 4 * local_20c);
        local_424 = -1;
        for (box.width = 0; box.width < 4; box.width = box.width + 1) {
          pvVar7 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                             ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0
                              ,(long)box.width);
          dmin = cv::norm<int>(pvVar7);
          if (dmin < dStack_420) {
            local_424 = box.width;
            dStack_420 = dmin;
          }
        }
        for (box.width = 0; box.width < 4; box.width = box.width + 1) {
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::at
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0,
                     (long)box.width);
          cv::Point_::operator_cast_to_Point_((Point_ *)&local_42c);
          pvVar8 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                             ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                              local_68,(long)box.width);
          cv::Point_<float>::operator=(pvVar8,&local_42c);
        }
        cv::_InputArray::_InputArray(&local_448,&this->grayImage);
        cv::_InputOutputArray::_InputOutputArray<cv::Point_<float>>
                  (&local_460,
                   (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68);
        cv::Size_<int>::Size_(&local_468,3,3);
        cv::Size_<int>::Size_(&local_470,-1,-1);
        cv::TermCriteria::TermCriteria(&local_480,1,3,1.0);
        cv::cornerSubPix(local_480.epsilon,&local_448,&local_460,&local_468,&local_470,
                         local_480._0_8_);
        cv::_InputOutputArray::~_InputOutputArray(&local_460);
        cv::_InputArray::~_InputArray(&local_448);
        for (box.width = 0; box.width < 4; box.width = box.width + 1) {
          iVar3 = local_424 - box.width;
          uVar4 = iVar3 + 4U;
          if ((int)(iVar3 + 4U) < 0) {
            uVar4 = iVar3 + 7;
          }
          pvVar8 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::at
                             ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                              local_68,(long)(int)((iVar3 + 4) - (uVar4 & 0xfffffffc)));
          fVar10 = pvVar8->x;
          iVar3 = local_424 - box.width;
          uVar4 = iVar3 + 4U;
          if ((int)(iVar3 + 4U) < 0) {
            uVar4 = iVar3 + 7;
          }
          pvVar8 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::at
                             ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                              local_68,(long)(int)((iVar3 + 4) - (uVar4 & 0xfffffffc)));
          cv::Point_<float>::Point_
                    ((Point_<float> *)&confidence,fVar10 - (float)pMaxY,pvVar8->y - (float)pMaxX);
          pvVar8 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                             ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                              local_38,(long)box.width);
          cv::Point_<float>::operator=(pvVar8,(Point_<float> *)&confidence);
        }
        rectifyPattern(this,&this->grayImage,
                       (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_38,
                       (Rect *)&d,(Mat *)local_2c8);
        _id = 0.0;
        camera.translation.val[1] =
             (float)identifyPattern(this,(Mat *)local_2c8,(double *)&id,
                                    (int *)(camera.translation.val + 2));
        if (-1 < (int)camera.translation.val[1]) {
          for (box.width = 0; box.width < 4; box.width = box.width + 1) {
            iVar3 = (local_424 - (int)camera.translation.val[2]) - box.width;
            uVar4 = iVar3 + 8U;
            if ((int)(iVar3 + 8U) < 0) {
              uVar4 = iVar3 + 0xb;
            }
            pvVar8 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::at
                               ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                                local_68,(long)(int)((iVar3 + 8) - (uVar4 & 0xfffffffc)));
            this_00 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::
                      operator[]((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                                 local_88,(long)box.width);
            cv::Point_<float>::operator=(this_00,pvVar8);
          }
          pvVar9 = std::vector<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>::operator[]
                             (&this->patterns,(long)(int)camera.translation.val[1]);
          fVar10 = BinaryPattern::getSize(pvVar9);
          calculateExtrinsics((CameraPosition *)local_4b0,this,fVar10,
                              (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                              local_88);
          this_01 = (PlanarLocalization *)operator_new(0x48);
          fVar10 = camera.translation.val[1];
          pvVar9 = std::vector<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>::operator[]
                             (&this->patterns,(long)(int)camera.translation.val[1]);
          _width = BinaryPattern::getSize(pvVar9);
          pvVar9 = std::vector<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>::operator[]
                             (&this->patterns,(long)(int)camera.translation.val[1]);
          _height = BinaryPattern::getSize(pvVar9);
          cv::Size_<float>::Size_(&local_4d8,_width,_height);
          std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                    (&local_4f0,
                     (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_88);
          PlanarLocalization::PlanarLocalization
                    (this_01,(int)fVar10,(CameraPosition *)local_4b0,&local_4d8,&local_4f0,
                     (float)_id);
          cv::Ptr<ary::PlanarLocalization>::Ptr<ary::PlanarLocalization>(&local_4d0,this_01);
          cv::Ptr<ary::Localization>::Ptr<ary::PlanarLocalization>(&local_4c0,&local_4d0);
          std::vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>::
          push_back(__return_storage_ptr__,&local_4c0);
          cv::Ptr<ary::Localization>::~Ptr(&local_4c0);
          cv::Ptr<ary::PlanarLocalization>::~Ptr(&local_4d0);
          std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector(&local_4f0);
        }
      }
    }
    cv::Mat::~Mat((Mat *)&per);
  }
  contourMat.step.buf[1]._7_1_ = 1;
  cv::Mat::~Mat((Mat *)local_2c8);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_c0);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)&polycont.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_88);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<SharedLocalization> BinaryPatternLocalizer::localize(const Mat& image) {

	vector<Point2f> roi(4);
	vector<Point2f> refined(4);
    vector<Point2f> rotated(4);

	vector<vector<Point> > contours;
	vector<Point> polycont;

    //binarize image
    if (image.channels() == 3) {
	    cvtColor(image, grayImage, COLOR_BGR2GRAY);
    }
    else {
	    image.copyTo(grayImage);
    }

    adaptiveThreshold(grayImage, binImage, 255, ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY_INV, block_size, (int) threshold);
    dilate(binImage, binImage, Mat());

	int avsize = (binImage.rows + binImage.cols) / 2;

	//find contours in binary image
	cv::findContours(binImage, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

	unsigned int i;
	Point p;
	int pMinX, pMinY, pMaxY, pMaxX;
    Mat rectifiedPatch(PATTERN_SIZE, PATTERN_SIZE, CV_8UC1);;

    vector<SharedLocalization> localizations;

	for (i = 0; i < contours.size(); i++) {
		Mat contourMat = Mat (contours[i]);
		const double per = arcLength( contourMat, true);
		//check the perimeter

		if (per > (avsize / 6) && per < (4 * avsize)) {

			polycont.clear();
			approxPolyDP( contourMat, polycont, per * 0.02, true);
			//check rectangularity and convexity
			if (polycont.size() == 4 && isContourConvex(Mat (polycont))) {

				//locate the 2D box of contour,
				p = polycont.at(0);
				pMinX = pMaxX = p.x;
				pMinY = pMaxY = p.y;
				int j;
				for (j = 1; j < 4; j++) {
					p = polycont.at(j);
					if (p.x < pMinX) {
						pMinX = p.x;
					}
					if (p.x > pMaxX) {
						pMaxX = p.x;
					}
					if (p.y < pMinY) {
						pMinY = p.y;
					}
					if (p.y > pMaxY) {
						pMaxY = p.y;
					}
				}
				Rect box(pMinX, pMinY, pMaxX - pMinX + 1, pMaxY - pMinY + 1);

				//find the upper left vertex
				double d;
				double dmin = (4 * avsize * avsize);
				int v1 = -1;
				for (j = 0; j < 4; j++) {
					d = norm(polycont.at(j));
					if (d < dmin) {
						dmin = d;
						v1 = j;
					}
				}

				//store vertices in refinedVertices and enable sub-pixel refinement if you want
				for (j = 0; j < 4; j++) {
					refined[j] = polycont.at(j);
				}

				//refine corners
				cornerSubPix(grayImage, refined, Size(3, 3), Size(-1, -1), TermCriteria(1, 3, 1));

				//rotate vertices based on upper left vertex; this gives you the most trivial homogrpahy
				for (j = 0; j < 4; j++) {
					roi[j] = Point2f(refined.at((4 + v1 - j) % 4).x - pMinX, refined.at((4 + v1 - j) % 4).y - pMinY);
				}

	            //rectify the candidate pattern (find homography and warp the ROI)
	            rectifyPattern(grayImage, roi, box, rectifiedPatch);

	            double confidence = 0;
	            int orientation;

	            int id = identifyPattern(rectifiedPatch, confidence, orientation);
	            //push-back pattern in the stack of foundPatterns and find its extrinsics

	            if (id >= 0) {

		            for (j = 0; j < 4; j++) {
			            rotated[j] = refined.at((8 - orientation + v1 - j) % 4);
		            }

		            //find the transformation (from camera CS to pattern CS)
		            CameraPosition camera = calculateExtrinsics(patterns[id].getSize(), rotated);
		            localizations.push_back(Ptr<PlanarLocalization>(new PlanarLocalization(id, camera, Size2f(patterns[id].getSize(), patterns[id].getSize()), rotated, (float) confidence)));

	            }


			}
		}
	}

    return localizations;
}